

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::MakeCheckOpValueString<signed_char>(ostream *os,char *v)

{
  ostream *poVar1;
  
  if ((byte)(*v + 0x81U) < 0xa1) {
    poVar1 = std::operator<<(os,"signed char value ");
    std::ostream::operator<<(poVar1,(short)*v);
    return;
  }
  poVar1 = std::operator<<(os,"\'");
  poVar1 = std::operator<<(poVar1,*v);
  std::operator<<(poVar1,"\'");
  return;
}

Assistant:

void MakeCheckOpValueString(std::ostream* os, const signed char& v) {
  if (v >= 32 && v <= 126) {
    (*os) << "'" << v << "'";
  } else {
    (*os) << "signed char value " << (short)v;
  }
}